

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

int add_tpl_ref_mv(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,MV_REFERENCE_FRAME ref_frame
                  ,int blk_row,int blk_col,int_mv *gm_mv_candidates,uint8_t *refmv_count,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,int16_t *mode_context)

{
  char cVar1;
  char cVar2;
  MV MVar3;
  TPL_MV_REF *pTVar4;
  SequenceHeader *pSVar5;
  undefined1 auVar6 [14];
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  ushort uVar10;
  byte bVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  ushort uVar21;
  uint uVar22;
  uint uVar23;
  byte local_3d;
  
  iVar13 = (mi_row | 1U) + blk_row;
  if (iVar13 < (xd->tile).mi_row_start) {
    return 0;
  }
  iVar19 = (~mi_col & 1U) + mi_col + blk_col;
  if (iVar19 < (xd->tile).mi_col_start) {
    return 0;
  }
  if ((xd->tile).mi_row_end <= iVar13) {
    return 0;
  }
  if ((xd->tile).mi_col_end <= iVar19) {
    return 0;
  }
  iVar13 = ((cm->mi_params).mi_stride >> 1) * (iVar13 >> 1);
  pTVar4 = cm->tpl_mvs;
  lVar16 = (long)(iVar19 >> 1);
  MVar3 = pTVar4[iVar13 + lVar16].mfmv0.as_mv;
  if (MVar3 == (MV)0x80008000) {
    return 0;
  }
  local_3d = 0xff;
  bVar11 = ref_frame;
  if ('\a' < ref_frame) {
    bVar11 = ref_frame_map[(byte)ref_frame - 8][0];
    local_3d = ref_frame_map[(byte)ref_frame - 8][1];
  }
  uVar20 = cm->cur_frame->order_hint;
  pSVar5 = cm->seq_params;
  iVar19 = (pSVar5->order_hint_info).enable_order_hint;
  if (iVar19 == 0) {
    cVar1 = (cm->features).allow_high_precision_mv;
    cVar2 = (cm->features).cur_frame_force_integer_mv;
    uVar22 = 0x1f;
    if ((byte)*(uint *)&pTVar4[iVar13 + lVar16].ref_frame_offset < 0x1f) {
      uVar22 = *(uint *)&pTVar4[iVar13 + lVar16].ref_frame_offset;
    }
    uVar22 = uVar22 & 0xff;
    uVar8 = 0;
LAB_003a00d2:
    uVar7 = 0xffffffe1;
    if (-0x1f < (int)uVar8) {
      uVar7 = uVar8;
    }
  }
  else {
    uVar22 = uVar20 - cm->ref_frame_map[cm->remapped_ref_idx[bVar11 - 1]]->order_hint;
    uVar23 = 1 << ((byte)(pSVar5->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    uVar7 = uVar23 - 1 & uVar22;
    uVar23 = uVar23 & uVar22;
    bVar11 = (byte)*(undefined4 *)&pTVar4[iVar13 + lVar16].ref_frame_offset;
    if (0x1e < bVar11) {
      bVar11 = 0x1f;
    }
    cVar1 = (cm->features).allow_high_precision_mv;
    cVar2 = (cm->features).cur_frame_force_integer_mv;
    uVar22 = (uint)bVar11;
    uVar8 = uVar7 - uVar23;
    if (uVar8 == 0 || (int)uVar7 < (int)uVar23) goto LAB_003a00d2;
    uVar7 = 0x1f;
    if (uVar8 < 0x1f) {
      uVar7 = uVar8;
    }
  }
  iVar13 = uVar7 * div_mult[uVar22];
  iVar14 = iVar13 * MVar3.row;
  if (iVar14 < 0) {
    uVar8 = -(0x2000U - iVar14 >> 0xe);
  }
  else {
    uVar8 = iVar14 + 0x2000U >> 0xe;
  }
  iVar13 = iVar13 * ((int)MVar3 >> 0x10);
  if (iVar13 < 0) {
    uVar7 = -(0x2000U - iVar13 >> 0xe);
  }
  else {
    uVar7 = iVar13 + 0x2000U >> 0xe;
  }
  uVar23 = 0x3fff;
  if ((int)uVar8 < 0x3fff) {
    uVar23 = uVar8;
  }
  uVar17 = (ulong)uVar23;
  if ((int)uVar23 < -0x3ffe) {
    uVar17 = 0xffffc001;
  }
  uVar23 = 0x3fff;
  if ((int)uVar7 < 0x3fff) {
    uVar23 = uVar7;
  }
  if ((int)uVar23 < -0x3ffe) {
    uVar23 = 0xffffc001;
  }
  uVar10 = (ushort)uVar23;
  uVar15 = (uint)uVar17;
  uVar9 = (ushort)uVar17;
  if (cVar2 == '\0') {
    if ((cVar1 == '\0') &&
       (uVar17 = (ulong)(((uint)((int)uVar8 < 1) * 2 - 1 & -(uVar15 & 1)) + uVar15),
       (uVar23 & 1) != 0)) {
      uVar23 = (uVar23 + (uint)((int)uVar7 < 1) * 2) - 1;
    }
  }
  else {
    uVar21 = uVar9 + 7;
    if (-1 < (short)uVar9) {
      uVar21 = uVar9;
    }
    uVar9 = uVar9 - (uVar21 & 0xfff8);
    if (uVar9 != 0) {
      uVar17 = (ulong)(uVar15 - uVar9);
      uVar21 = -uVar9;
      if (0 < (short)uVar9) {
        uVar21 = uVar9;
      }
      if (4 < uVar21) {
        uVar17 = (ulong)(((uVar15 - uVar9) + (uint)(0 < (short)uVar9) * 0x10) - 8);
      }
    }
    uVar9 = uVar10 + 7;
    if (-1 < (short)uVar10) {
      uVar9 = uVar10;
    }
    uVar10 = uVar10 - (uVar9 & 0xfff8);
    if (uVar10 != 0) {
      uVar23 = uVar23 - uVar10;
      uVar9 = -uVar10;
      if (0 < (short)uVar10) {
        uVar9 = uVar10;
      }
      if (4 < uVar9) {
        uVar23 = (uVar23 + (uint)(0 < (short)uVar10) * 0x10) - 8;
      }
    }
  }
  sVar12 = (short)uVar23;
  if (local_3d == 0xff) {
    if (blk_col == 0 && blk_row == 0) {
      iVar19 = (int)(short)uVar17 - (int)(gm_mv_candidates->as_mv).row;
      iVar13 = -iVar19;
      if (0 < iVar19) {
        iVar13 = iVar19;
      }
      if ((ushort)iVar13 < 0x10) {
        iVar19 = (int)sVar12 - (int)(gm_mv_candidates->as_mv).col;
        iVar13 = -iVar19;
        if (0 < iVar19) {
          iVar13 = iVar19;
        }
        if ((ushort)iVar13 < 0x10) goto LAB_003a0306;
      }
      *(byte *)(mode_context + ref_frame) = *(byte *)(mode_context + ref_frame) | 8;
    }
LAB_003a0306:
    bVar11 = *refmv_count;
    uVar20 = (uint)bVar11;
    if ((ulong)bVar11 == 0) {
      bVar11 = 0;
      uVar20 = 0;
    }
    else {
      uVar18 = 0;
      do {
        if (((uint)uVar17 & 0xffff | uVar23 << 0x10) == ref_mv_stack[uVar18].this_mv.as_int) {
          ref_mv_weight[uVar18] = ref_mv_weight[uVar18] + 2;
          bVar11 = *refmv_count;
          uVar20 = (uint)uVar18;
          break;
        }
        uVar18 = uVar18 + 1;
      } while (bVar11 != uVar18);
    }
    if (7 < bVar11 || uVar20 != bVar11) {
      return 1;
    }
    uVar18 = (ulong)uVar20;
    ref_mv_stack[uVar18].this_mv.as_int = (uint)uVar17 & 0xffff | uVar23 << 0x10;
    goto LAB_003a05f5;
  }
  if (iVar19 == 0) {
    uVar20 = 0;
LAB_003a0345:
    uVar8 = 0xffffffe1;
    if (-0x1f < (int)uVar20) {
      uVar8 = uVar20;
    }
  }
  else {
    uVar20 = uVar20 - cm->ref_frame_map[cm->remapped_ref_idx[local_3d - 1]]->order_hint;
    uVar8 = 1 << ((byte)(pSVar5->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    uVar7 = uVar8 - 1 & uVar20;
    uVar8 = uVar8 & uVar20;
    uVar20 = uVar7 - uVar8;
    if (uVar20 == 0 || (int)uVar7 < (int)uVar8) goto LAB_003a0345;
    uVar8 = 0x1f;
    if (uVar20 < 0x1f) {
      uVar8 = uVar20;
    }
  }
  iVar19 = uVar8 * div_mult[uVar22];
  iVar13 = MVar3.row * iVar19;
  if (iVar13 < 0) {
    uVar20 = -(0x2000U - iVar13 >> 0xe);
  }
  else {
    uVar20 = iVar13 + 0x2000U >> 0xe;
  }
  iVar19 = iVar19 * ((int)MVar3 >> 0x10);
  if (iVar19 < 0) {
    uVar22 = -(0x2000U - iVar19 >> 0xe);
  }
  else {
    uVar22 = iVar19 + 0x2000U >> 0xe;
  }
  uVar8 = 0x3fff;
  if ((int)uVar20 < 0x3fff) {
    uVar8 = uVar20;
  }
  if ((int)uVar8 < -0x3ffe) {
    uVar8 = 0xffffc001;
  }
  uVar10 = (ushort)uVar8;
  uVar7 = 0x3fff;
  if ((int)uVar22 < 0x3fff) {
    uVar7 = uVar22;
  }
  if ((int)uVar7 < -0x3ffe) {
    uVar7 = 0xffffc001;
  }
  uVar9 = (ushort)uVar7;
  if (cVar2 == '\0') {
    if ((cVar1 == '\0') &&
       (uVar8 = ((uint)((int)uVar20 < 1) * 2 - 1 & -(uVar8 & 1)) + uVar8, (uVar7 & 1) != 0)) {
      uVar7 = (uVar7 + (uint)((int)uVar22 < 1) * 2) - 1;
    }
  }
  else {
    uVar21 = uVar10 + 7;
    if (-1 < (short)uVar10) {
      uVar21 = uVar10;
    }
    uVar10 = uVar10 - (uVar21 & 0xfff8);
    if (uVar10 != 0) {
      uVar8 = uVar8 - uVar10;
      uVar21 = -uVar10;
      if (0 < (short)uVar10) {
        uVar21 = uVar10;
      }
      if (4 < uVar21) {
        uVar8 = (uVar8 + (uint)(0 < (short)uVar10) * 0x10) - 8;
      }
    }
    uVar10 = uVar9 + 7;
    if (-1 < (short)uVar9) {
      uVar10 = uVar9;
    }
    uVar9 = uVar9 - (uVar10 & 0xfff8);
    if (uVar9 != 0) {
      uVar7 = uVar7 - uVar9;
      uVar10 = -uVar9;
      if (0 < (short)uVar9) {
        uVar10 = uVar9;
      }
      if (4 < uVar10) {
        uVar7 = (uVar7 + (uint)(0 < (short)uVar9) * 0x10) - 8;
      }
    }
  }
  if (blk_col == 0 && blk_row == 0) {
    iVar13 = (int)(short)uVar17 - (int)(gm_mv_candidates->as_mv).row;
    uVar10 = (ushort)iVar13;
    uVar9 = -uVar10;
    if (0 < iVar13) {
      uVar9 = uVar10;
    }
    if (uVar9 < 0x10) {
      iVar13 = (int)sVar12 - (int)(gm_mv_candidates->as_mv).col;
      uVar10 = (ushort)iVar13;
      uVar9 = -uVar10;
      if (0 < iVar13) {
        uVar9 = uVar10;
      }
      if (uVar9 < 0x10) {
        iVar13 = (int)(short)uVar8 - (int)gm_mv_candidates[1].as_mv.row;
        uVar10 = (ushort)iVar13;
        uVar9 = -uVar10;
        if (0 < iVar13) {
          uVar9 = uVar10;
        }
        if (uVar9 < 0x10) {
          iVar19 = (int)(short)(ushort)uVar7 - (int)*(short *)((long)gm_mv_candidates + 6);
          iVar13 = -iVar19;
          if (0 < iVar19) {
            iVar13 = iVar19;
          }
          if ((ushort)iVar13 < 0x10) goto LAB_003a0525;
        }
      }
    }
    *(byte *)(mode_context + ref_frame) = *(byte *)(mode_context + ref_frame) | 8;
  }
LAB_003a0525:
  bVar11 = *refmv_count;
  uVar20 = (uint)bVar11;
  if ((ulong)bVar11 == 0) {
    bVar11 = 0;
    uVar20 = 0;
  }
  else {
    uVar18 = 0;
    do {
      if (((uVar23 << 0x10 | (uint)(uVar17 & 0xffff)) == ref_mv_stack[uVar18].this_mv.as_int) &&
         ((uVar8 & 0xffff | uVar7 << 0x10) == ref_mv_stack[uVar18].comp_mv.as_int)) {
        ref_mv_weight[uVar18] = ref_mv_weight[uVar18] + 2;
        bVar11 = *refmv_count;
        uVar20 = (uint)uVar18;
        break;
      }
      uVar18 = uVar18 + 1;
    } while (bVar11 != uVar18);
  }
  if (7 < bVar11 || uVar20 != bVar11) {
    return 1;
  }
  uVar18 = (ulong)uVar20;
  auVar6._2_12_ = SUB1612(ZEXT216((ushort)uVar7) << 0x30,4);
  auVar6._0_2_ = sVar12;
  ref_mv_stack[uVar18] =
       (CANDIDATE_MV)(auVar6._0_8_ << 0x10 | uVar17 & 0xffff | (ulong)(uVar8 & 0xffff) << 0x20);
LAB_003a05f5:
  ref_mv_weight[uVar18] = 2;
  *refmv_count = *refmv_count + '\x01';
  return 1;
}

Assistant:

static int add_tpl_ref_mv(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                          int mi_row, int mi_col, MV_REFERENCE_FRAME ref_frame,
                          int blk_row, int blk_col, int_mv *gm_mv_candidates,
                          uint8_t *const refmv_count,
                          CANDIDATE_MV ref_mv_stack[MAX_REF_MV_STACK_SIZE],
                          uint16_t ref_mv_weight[MAX_REF_MV_STACK_SIZE],
                          int16_t *mode_context) {
  POSITION mi_pos;
  mi_pos.row = (mi_row & 0x01) ? blk_row : blk_row + 1;
  mi_pos.col = (mi_col & 0x01) ? blk_col : blk_col + 1;

  if (!is_inside(&xd->tile, mi_col, mi_row, &mi_pos)) return 0;

  const TPL_MV_REF *prev_frame_mvs =
      cm->tpl_mvs +
      ((mi_row + mi_pos.row) >> 1) * (cm->mi_params.mi_stride >> 1) +
      ((mi_col + mi_pos.col) >> 1);
  if (prev_frame_mvs->mfmv0.as_int == INVALID_MV) return 0;

  MV_REFERENCE_FRAME rf[2];
  av1_set_ref_frame(rf, ref_frame);

  const uint16_t weight_unit = 1;  // mi_size_wide[BLOCK_8X8];
  const int cur_frame_index = cm->cur_frame->order_hint;
  const RefCntBuffer *const buf_0 = get_ref_frame_buf(cm, rf[0]);
  const int frame0_index = buf_0->order_hint;
  const int cur_offset_0 = get_relative_dist(&cm->seq_params->order_hint_info,
                                             cur_frame_index, frame0_index);
  int idx;
  const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
  const int force_integer_mv = cm->features.cur_frame_force_integer_mv;

  int_mv this_refmv;
  get_mv_projection(&this_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                    cur_offset_0, prev_frame_mvs->ref_frame_offset);
  lower_mv_precision(&this_refmv.as_mv, allow_high_precision_mv,
                     force_integer_mv);

  if (rf[1] == NONE_FRAME) {
    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx)
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int) break;

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  } else {
    // Process compound inter mode
    const RefCntBuffer *const buf_1 = get_ref_frame_buf(cm, rf[1]);
    const int frame1_index = buf_1->order_hint;
    const int cur_offset_1 = get_relative_dist(&cm->seq_params->order_hint_info,
                                               cur_frame_index, frame1_index);
    int_mv comp_refmv;
    get_mv_projection(&comp_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                      cur_offset_1, prev_frame_mvs->ref_frame_offset);
    lower_mv_precision(&comp_refmv.as_mv, allow_high_precision_mv,
                       force_integer_mv);

    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16 ||
          abs(comp_refmv.as_mv.row - gm_mv_candidates[1].as_mv.row) >= 16 ||
          abs(comp_refmv.as_mv.col - gm_mv_candidates[1].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx) {
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int &&
          comp_refmv.as_int == ref_mv_stack[idx].comp_mv.as_int)
        break;
    }

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_stack[idx].comp_mv.as_int = comp_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  }

  return 1;
}